

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O0

bool TasOptimization::testGradientDescent(bool verbose)

{
  allocator<double> *this;
  bool bVar1;
  size_type __n;
  vector *pvVar2;
  reference pvVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  double extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double dVar5;
  undefined8 extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  int local_21c;
  undefined1 local_218 [4];
  int i_6;
  undefined4 local_200;
  undefined8 local_1f8;
  int local_1f0;
  int local_1ec;
  int t_2;
  int i_5;
  undefined4 local_1d0;
  undefined8 local_1c8;
  int local_1c0;
  anon_class_1_0_00000001 local_1b9;
  int i_4;
  ProjectionFunctionSingle proj;
  undefined1 local_190 [4];
  int i_3;
  undefined4 local_178;
  undefined8 local_170;
  int local_168;
  int local_164;
  int t_1;
  int i_2;
  undefined4 local_148;
  undefined8 local_140;
  int local_134;
  undefined1 local_130 [4];
  int i_1;
  undefined4 local_118;
  undefined8 local_110;
  int local_108;
  int local_104;
  int t;
  int i;
  vector<double,_std::allocator<double>_> x_gd;
  undefined1 local_d8 [8];
  GradientDescentState state;
  value_type_conflict1 local_b0;
  undefined1 local_a8 [8];
  vector<double,_std::allocator<double>_> x0;
  allocator<double> local_79;
  undefined1 local_78 [8];
  vector<double,_std::allocator<double>_> x_optimal;
  int num_dimensions;
  double L;
  GradientFunctionSingle grad;
  ObjectiveFunctionSingle func;
  test_result test;
  bool verbose_local;
  
  func._M_invoker._7_1_ = verbose;
  test_result::test_result((test_result *)((long)&func._M_invoker + 5));
  std::function<double_(const_std::vector<double,_std::allocator<double>_>_&)>::function
            ((function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *)
             &grad._M_invoker);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
              *)&L);
  x_optimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0xb;
  std::allocator<double>::allocator(&local_79);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_78,0xb,&local_79);
  std::allocator<double>::~allocator(&local_79);
  makeNesterovTestFunction
            (10.0,(x_optimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + -1) -
                  (x_optimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + -1 >> 0x1f) >> 1,
             (ObjectiveFunctionSingle *)&grad._M_invoker,(GradientFunctionSingle *)&L,
             (vector<double,_std::allocator<double>_> *)local_78);
  __n = (size_type)
        x_optimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_;
  local_b0 = 0.0;
  this = (allocator<double> *)
         ((long)&state.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(this);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_a8,__n,&local_b0,this);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&state.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  GradientDescentState::GradientDescentState
            ((GradientDescentState *)local_d8,(vector<double,_std::allocator<double>_> *)local_a8,
             0.0);
  pvVar2 = (vector *)
           GradientDescentState::operator_cast_to_vector_((GradientDescentState *)local_d8);
  x_gd.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = TasOptimization::GradientDescent((function *)&L,0.1,300,1e-06,pvVar2);
  GradientDescentState::getX
            ((vector<double,_std::allocator<double>_> *)&t,(GradientDescentState *)local_d8);
  for (local_104 = 0;
      local_104 <
      x_optimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; local_104 = local_104 + 1) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)&t,(long)local_104);
    pvVar4 = (vector<double,_std::allocator<double>_> *)local_78;
    std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_104);
    std::abs((int)pvVar4);
    test_result::tassert((test_result *)((long)&func._M_invoker + 5),extraout_XMM0_Qa <= 1e-06);
  }
  GradientDescentState::setX
            ((GradientDescentState *)local_d8,(vector<double,_std::allocator<double>_> *)local_a8);
  for (local_108 = 0; local_108 < 300; local_108 = local_108 + 1) {
    pvVar2 = (vector *)
             GradientDescentState::operator_cast_to_vector_((GradientDescentState *)local_d8);
    local_118 = TasOptimization::GradientDescent((function *)&L,0.1,1,1e-06,pvVar2);
    local_110 = extraout_XMM0_Qa_00;
  }
  GradientDescentState::getX
            ((vector<double,_std::allocator<double>_> *)local_130,(GradientDescentState *)local_d8);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&t,
             (vector<double,_std::allocator<double>_> *)local_130);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_130);
  for (local_134 = 0;
      local_134 <
      x_optimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; local_134 = local_134 + 1) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)&t,(long)local_134);
    pvVar4 = (vector<double,_std::allocator<double>_> *)local_78;
    std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_134);
    std::abs((int)pvVar4);
    test_result::tassert((test_result *)((long)&func._M_invoker + 5),extraout_XMM0_Qa_01 <= 1e-06);
  }
  GradientDescentState::setAdaptiveStepsize((GradientDescentState *)local_d8,1.0);
  GradientDescentState::setX
            ((GradientDescentState *)local_d8,(vector<double,_std::allocator<double>_> *)local_a8);
  local_148 = TasOptimization::GradientDescent
                        ((function *)&grad._M_invoker,(function *)&L,1.5,1.25,300,1e-06,
                         (GradientDescentState *)local_d8);
  local_140 = extraout_XMM0_Qa_02;
  GradientDescentState::getX
            ((vector<double,_std::allocator<double>_> *)&t_1,(GradientDescentState *)local_d8);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&t,
             (vector<double,_std::allocator<double>_> *)&t_1);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&t_1);
  for (local_164 = 0;
      local_164 <
      x_optimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; local_164 = local_164 + 1) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)&t,(long)local_164);
    pvVar4 = (vector<double,_std::allocator<double>_> *)local_78;
    std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_164);
    std::abs((int)pvVar4);
    test_result::tassert((test_result *)((long)&func._M_invoker + 5),extraout_XMM0_Qa_03 <= 1e-06);
  }
  GradientDescentState::setX
            ((GradientDescentState *)local_d8,(vector<double,_std::allocator<double>_> *)local_a8);
  for (local_168 = 0; local_168 < 300; local_168 = local_168 + 1) {
    local_178 = TasOptimization::GradientDescent
                          ((function *)&grad._M_invoker,(function *)&L,1.5,1.25,1,1e-06,
                           (GradientDescentState *)local_d8);
    local_170 = extraout_XMM0_Qa_04;
  }
  GradientDescentState::getX
            ((vector<double,_std::allocator<double>_> *)local_190,(GradientDescentState *)local_d8);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&t,
             (vector<double,_std::allocator<double>_> *)local_190);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_190);
  for (proj._M_invoker._4_4_ = 0;
      proj._M_invoker._4_4_ <
      x_optimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; proj._M_invoker._4_4_ = proj._M_invoker._4_4_ + 1) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)&t,(long)proj._M_invoker._4_4_);
    pvVar4 = (vector<double,_std::allocator<double>_> *)local_78;
    std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)proj._M_invoker._4_4_);
    std::abs((int)pvVar4);
    test_result::tassert((test_result *)((long)&func._M_invoker + 5),extraout_XMM0_Qa_05 <= 1e-06);
  }
  std::
  function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
  ::function<TasOptimization::testGradientDescent(bool)::__0,void>
            ((function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
              *)&i_4,&local_1b9);
  for (local_1c0 = 0;
      local_1c0 <
      (x_optimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage._4_4_ + -1) / 2; local_1c0 = local_1c0 + 1) {
    dVar5 = (double)local_1c0;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_78,(long)local_1c0);
    *pvVar3 = dVar5 * -0.1 + 0.5;
  }
  GradientDescentState::setAdaptiveStepsize((GradientDescentState *)local_d8,1.0);
  GradientDescentState::setX
            ((GradientDescentState *)local_d8,(vector<double,_std::allocator<double>_> *)local_a8);
  local_1d0 = TasOptimization::GradientDescent
                        ((function *)&grad._M_invoker,(function *)&L,(function *)&i_4,1.5,1.25,300,
                         1e-06,(GradientDescentState *)local_d8);
  local_1c8 = extraout_XMM0_Qa_06;
  GradientDescentState::getX
            ((vector<double,_std::allocator<double>_> *)&t_2,(GradientDescentState *)local_d8);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&t,
             (vector<double,_std::allocator<double>_> *)&t_2);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&t_2);
  for (local_1ec = 0;
      local_1ec <
      x_optimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; local_1ec = local_1ec + 1) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)&t,(long)local_1ec);
    pvVar4 = (vector<double,_std::allocator<double>_> *)local_78;
    std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_1ec);
    std::abs((int)pvVar4);
    test_result::tassert((test_result *)((long)&func._M_invoker + 5),extraout_XMM0_Qa_07 <= 1e-06);
  }
  for (local_1f0 = 0; local_1f0 < 300; local_1f0 = local_1f0 + 1) {
    local_200 = TasOptimization::GradientDescent
                          ((function *)&grad._M_invoker,(function *)&L,(function *)&i_4,1.5,1.25,1,
                           1e-06,(GradientDescentState *)local_d8);
    local_1f8 = extraout_XMM0_Qa_08;
  }
  GradientDescentState::getX
            ((vector<double,_std::allocator<double>_> *)local_218,(GradientDescentState *)local_d8);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&t,
             (vector<double,_std::allocator<double>_> *)local_218);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_218);
  for (local_21c = 0;
      local_21c <
      x_optimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; local_21c = local_21c + 1) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)&t,(long)local_21c);
    pvVar4 = (vector<double,_std::allocator<double>_> *)local_78;
    std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
    std::abs((int)pvVar4);
    test_result::tassert((test_result *)((long)&func._M_invoker + 5),extraout_XMM0_Qa_09 <= 1e-06);
  }
  bVar1 = test_result::failed_any((test_result *)((long)&func._M_invoker + 5));
  if ((bVar1) || ((func._M_invoker._7_1_ & 1) != 0)) {
    bVar1 = test_result::success((test_result *)((long)&func._M_invoker + 5));
    reportPassFail(bVar1,"Gradient Descent","Algorithm Unit Tests");
  }
  bVar1 = test_result::success((test_result *)((long)&func._M_invoker + 5));
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::~function((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
               *)&i_4);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&t);
  GradientDescentState::~GradientDescentState((GradientDescentState *)local_d8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_a8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_78);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::~function((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
               *)&L);
  std::function<double_(const_std::vector<double,_std::allocator<double>_>_&)>::~function
            ((function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *)
             &grad._M_invoker);
  return bVar1;
}

Assistant:

bool testGradientDescent(bool verbose) {
    test_result test;

    // Nesterov's "worst function in the world".
    ObjectiveFunctionSingle func;
    GradientFunctionSingle grad;
    double L = 10;
    int num_dimensions = 11;
    std::vector<double> x_optimal(num_dimensions);
    makeNesterovTestFunction(L, (num_dimensions-1)/2, func, grad, x_optimal);

    // Constant stepsize gradient descent.
    std::vector<double> x0(num_dimensions, 0);
    GradientDescentState state(x0, 0);
    GradientDescent(grad, 1.0/L, 300, 1E-6, state);
    std::vector<double> x_gd = state.getX();
    for (int i=0; i<num_dimensions; i++) test.tassert(std::abs(x_gd[i] - x_optimal[i]) <= 1E-6);
    state.setX(x0);
    for (int t=0; t<300; t++) GradientDescent(grad, 1.0/L, 1, 1E-6, state);
    x_gd = state.getX();
    for (int i=0; i<num_dimensions; i++) test.tassert(std::abs(x_gd[i] - x_optimal[i]) <= 1E-6);

    // Variable stepsize gradient descent.
    state.setAdaptiveStepsize(10.0/L);
    state.setX(x0);
    GradientDescent(func, grad, 1.5, 1.25, 300, 1E-6, state);
    x_gd = state.getX();
    for (int i=0; i<num_dimensions; i++) test.tassert(std::abs(x_gd[i] - x_optimal[i]) <= 1E-6);
    state.setX(x0);
    for (int t=0; t<300; t++) GradientDescent(func, grad, 1.5, 1.25, 1, 1E-6, state);
    x_gd = state.getX();
    for (int i=0; i<num_dimensions; i++) test.tassert(std::abs(x_gd[i] - x_optimal[i]) <= 1E-6);

    // Proximal/Projected gradient descent (optimum now lies on the boundary).
    ProjectionFunctionSingle proj = [](const std::vector<double> &x, std::vector<double> &p) {
        for (size_t i=0; i<p.size(); i++) p[i] = std::min(std::max(x[i], -0.5), 0.5);
    };
    for (int i=0; i<(num_dimensions-1)/2; i++) x_optimal[i] = 0.5 - 0.1 * i;
    state.setAdaptiveStepsize(10.0/L);
    state.setX(x0);
    GradientDescent(func, grad, proj, 1.5, 1.25, 300, 1E-6, state);
    x_gd = state.getX();
    for (int i=0; i<num_dimensions; i++) test.tassert(std::abs(x_gd[i] - x_optimal[i]) <= 1E-6);
    for (int t=0; t<300; t++) GradientDescent(func, grad, proj, 1.5, 1.25, 1, 1E-6, state);
    x_gd = state.getX();
    for (int i=0; i<num_dimensions; i++) test.tassert(std::abs(x_gd[i] - x_optimal[i]) <= 1E-6);

    // Reporting.
    if (test.failed_any() or verbose) reportPassFail(test.success(), "Gradient Descent", "Algorithm Unit Tests");
    return test.success();
}